

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fruit.cpp
# Opt level: O0

ostream * L13_4::operator<<(ostream *os,Fruit *d)

{
  ostream *poVar1;
  Fruit *d_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Name: ");
  poVar1 = std::operator<<(poVar1,d->_name);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, const Fruit &d) {
        os << "Name: " << d._name << std::endl;
        return os;
    }